

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NonMaximumSuppression::SerializeWithCachedSizes
          (NonMaximumSuppression *this,CodedOutputStream *output)

{
  double dVar1;
  string *psVar2;
  size_type sVar3;
  uint32 uVar4;
  
  if (this->_oneof_case_[0] == 1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->SuppressionMethod_).picktop_)->super_MessageLite,output);
  }
  uVar4 = this->_oneof_case_[1];
  if (uVar4 == 100) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (100,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
    uVar4 = this->_oneof_case_[1];
  }
  if (uVar4 == 0x65) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x65,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
  }
  dVar1 = this->iouthreshold_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    google::protobuf::internal::WireFormatLite::WriteDouble(0x6e,dVar1,output);
  }
  dVar1 = this->confidencethreshold_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    google::protobuf::internal::WireFormatLite::WriteDouble(0x6f,dVar1,output);
  }
  psVar2 = (this->confidenceinputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.confidenceInputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (200,(this->confidenceinputfeaturename_).ptr_,output);
  }
  psVar2 = (this->coordinatesinputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.coordinatesInputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xc9,(this->coordinatesinputfeaturename_).ptr_,output);
  }
  psVar2 = (this->iouthresholdinputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.iouThresholdInputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xca,(this->iouthresholdinputfeaturename_).ptr_,output);
  }
  psVar2 = (this->confidencethresholdinputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.confidenceThresholdInputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xcb,(this->confidencethresholdinputfeaturename_).ptr_,output);
  }
  psVar2 = (this->confidenceoutputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.confidenceOutputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xd2,(this->confidenceoutputfeaturename_).ptr_,output);
  }
  psVar2 = (this->coordinatesoutputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.coordinatesOutputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xd3,(this->coordinatesoutputfeaturename_).ptr_,output);
    return;
  }
  return;
}

Assistant:

void NonMaximumSuppression::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NonMaximumSuppression)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.NonMaximumSuppression.PickTop pickTop = 1;
  if (has_picktop()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *SuppressionMethod_.picktop_, output);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (has_stringclasslabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      100, *ClassLabels_.stringclasslabels_, output);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (has_int64classlabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      101, *ClassLabels_.int64classlabels_, output);
  }

  // double iouThreshold = 110;
  if (this->iouthreshold() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(110, this->iouthreshold(), output);
  }

  // double confidenceThreshold = 111;
  if (this->confidencethreshold() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(111, this->confidencethreshold(), output);
  }

  // string confidenceInputFeatureName = 200;
  if (this->confidenceinputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->confidenceinputfeaturename().data(), this->confidenceinputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.confidenceInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      200, this->confidenceinputfeaturename(), output);
  }

  // string coordinatesInputFeatureName = 201;
  if (this->coordinatesinputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->coordinatesinputfeaturename().data(), this->coordinatesinputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.coordinatesInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      201, this->coordinatesinputfeaturename(), output);
  }

  // string iouThresholdInputFeatureName = 202;
  if (this->iouthresholdinputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->iouthresholdinputfeaturename().data(), this->iouthresholdinputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.iouThresholdInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      202, this->iouthresholdinputfeaturename(), output);
  }

  // string confidenceThresholdInputFeatureName = 203;
  if (this->confidencethresholdinputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->confidencethresholdinputfeaturename().data(), this->confidencethresholdinputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.confidenceThresholdInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      203, this->confidencethresholdinputfeaturename(), output);
  }

  // string confidenceOutputFeatureName = 210;
  if (this->confidenceoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->confidenceoutputfeaturename().data(), this->confidenceoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.confidenceOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      210, this->confidenceoutputfeaturename(), output);
  }

  // string coordinatesOutputFeatureName = 211;
  if (this->coordinatesoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->coordinatesoutputfeaturename().data(), this->coordinatesoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.coordinatesOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      211, this->coordinatesoutputfeaturename(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NonMaximumSuppression)
}